

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::decodeCop2BranchCondition(MipsParser *this,string *text,size_t *pos,int *result)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  undefined1 *puVar4;
  int *result_local;
  size_t *pos_local;
  string *text_local;
  MipsParser *this_local;
  
  sVar1 = *pos;
  lVar3 = std::__cxx11::string::size();
  if (sVar1 + 3 == lVar3) {
    bVar2 = startsWith(text,"any",*pos);
    if (bVar2) {
      *result = 4;
      *pos = *pos + 3;
      return true;
    }
    bVar2 = startsWith(text,"all",*pos);
    if (bVar2) {
      *result = 5;
      *pos = *pos + 3;
      return true;
    }
  }
  else {
    sVar1 = *pos;
    lVar3 = std::__cxx11::string::size();
    if (sVar1 + 1 == lVar3) {
      *pos = *pos + 1;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)text);
      switch(*puVar4) {
      case 0x30:
      case 0x78:
        *result = 0;
        return true;
      case 0x31:
      case 0x79:
        *result = 1;
        return true;
      case 0x32:
      case 0x7a:
        *result = 2;
        return true;
      case 0x33:
      case 0x77:
        *result = 3;
        return true;
      case 0x34:
        *result = 4;
        return true;
      case 0x35:
        *result = 5;
        return true;
      default:
        *pos = *pos - 1;
      }
    }
  }
  return false;
}

Assistant:

bool MipsParser::decodeCop2BranchCondition(const std::string& text, size_t& pos, int& result)
{
	if (pos+3 == text.size())
	{
		if (startsWith(text,"any",pos))
		{
			result = 4;
			pos += 3;
			return true;
		}
		if (startsWith(text,"all",pos))
		{
			result = 5;
			pos += 3;
			return true;
		}
	} else if (pos+1 == text.size())
	{
		switch (text[pos++])
		{
		case 'x':
		case '0':
			result = 0;
			return true;
		case 'y':
		case '1':
			result = 1;
			return true;
		case 'z':
		case '2':
			result = 2;
			return true;
		case 'w':
		case '3':
			result = 3;
			return true;
		case '4':
			result = 4;
			return true;
		case '5':
			result = 5;
			return true;
		}

		// didn't match it
		pos--;
	}

	return false;
}